

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMBasicBlockRef GetLoopContinueBlock(LlvmCompilationContext *ctx,uint depth)

{
  LoopInfo *pLVar1;
  uint local_1c;
  uint local_18;
  uint i;
  uint pos;
  uint depth_local;
  LlvmCompilationContext *ctx_local;
  
  local_18 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::size(&ctx->loopInfo);
  for (local_1c = 0; local_1c < depth; local_1c = local_1c + 1) {
    do {
      local_18 = local_18 - 1;
      pLVar1 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::operator[]
                         (&ctx->loopInfo,local_18);
    } while (pLVar1->continueBlock == (LLVMBasicBlockRef)0x0);
  }
  pLVar1 = SmallArray<LlvmCompilationContext::LoopInfo,_32U>::operator[](&ctx->loopInfo,local_18);
  return pLVar1->continueBlock;
}

Assistant:

LLVMBasicBlockRef GetLoopContinueBlock(LlvmCompilationContext &ctx, unsigned depth)
{
	unsigned pos = ctx.loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!ctx.loopInfo[pos].continueBlock)
			pos--;
	}

	return ctx.loopInfo[pos].continueBlock;
}